

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_reverse(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  JSValueUnion JVar5;
  JSValue val;
  int iVar6;
  int iVar7;
  JSValueUnion JVar8;
  ulong uVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  JSRefCountHeader *p;
  ulong uVar12;
  long idx;
  long idx_00;
  JSValue v;
  JSValue obj;
  JSValue JVar13;
  int64_t len;
  JSValue hval;
  JSValueUnion local_58;
  int64_t iStack_50;
  ulong local_48;
  JSValue local_40;
  
  local_58.int32 = 0;
  iStack_50 = 3;
  obj = JS_ToObject(ctx,this_val);
  JVar8 = obj.u;
  iVar6 = js_get_length64(ctx,(int64_t *)&local_48,obj);
  if (iVar6 == 0) {
    if (((((uint)obj.tag == 0xffffffff) && (*(short *)((long)JVar8.ptr + 6) == 2)) &&
        ((*(byte *)((long)JVar8.ptr + 5) & 8) != 0)) &&
       (uVar1 = *(uint *)((long)JVar8.ptr + 0x40), local_48 == uVar1)) {
      if (1 < uVar1) {
        puVar10 = *(undefined8 **)((long)JVar8.ptr + 0x38);
        uVar9 = (ulong)(uVar1 - 1);
        puVar11 = puVar10 + uVar9 * 2;
        uVar12 = 0;
        do {
          uVar9 = uVar9 - 1;
          uVar2 = *puVar10;
          uVar3 = puVar10[1];
          uVar4 = puVar11[1];
          *puVar10 = *puVar11;
          puVar10[1] = uVar4;
          *puVar11 = uVar2;
          puVar11[1] = uVar3;
          uVar12 = uVar12 + 1;
          puVar10 = puVar10 + 2;
          puVar11 = puVar11 + -2;
        } while (uVar12 < (uVar9 & 0xffffffff));
      }
    }
    else if (1 < (long)local_48) {
      idx = local_48 - 1;
      idx_00 = 0;
LAB_00162de4:
      iVar6 = JS_TryGetPropertyInt64(ctx,obj,idx_00,(JSValue *)&local_58);
      if (-1 < iVar6) {
        iVar7 = JS_TryGetPropertyInt64(ctx,obj,idx,&local_40);
        if (iVar7 < 0) goto LAB_00162ef0;
        if (iVar7 == 0) {
          if (iVar6 != 0) {
            iVar6 = JS_DeletePropertyInt64(ctx,obj,idx_00,0x4000);
            if (-1 < iVar6) goto LAB_00162e85;
            goto LAB_00162ef0;
          }
LAB_00162eb7:
          idx_00 = idx_00 + 1;
          idx = idx + -1;
          if (idx <= idx_00) goto LAB_00162ec9;
          goto LAB_00162de4;
        }
        iVar7 = JS_SetPropertyInt64(ctx,obj,idx_00,local_40);
        if (iVar7 < 0) goto LAB_00162ef0;
        if (iVar6 != 0) {
LAB_00162e85:
          val.u._4_4_ = local_58._4_4_;
          val.u.int32 = local_58.int32;
          val.tag = iStack_50;
          iVar6 = JS_SetPropertyInt64(ctx,obj,idx,val);
          if (-1 < iVar6) {
            local_58.int32 = 0;
            iStack_50 = 3;
            goto LAB_00162eb7;
          }
          goto LAB_00162d85;
        }
        iVar6 = JS_DeletePropertyInt64(ctx,obj,idx,0x4000);
        if (-1 < iVar6) goto LAB_00162eb7;
      }
LAB_00162ef0:
      if (0xfffffff4 < (uint)iStack_50) {
        JVar5._4_4_ = local_58._4_4_;
        JVar5.int32 = local_58.int32;
        iVar6 = *JVar5.ptr;
        *(int *)JVar5.ptr = iVar6 + -1;
        if (iVar6 < 2) {
          v.tag = iStack_50;
          v.u.ptr = JVar5.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
      }
      goto LAB_00162d85;
    }
LAB_00162ec9:
    uVar9 = (ulong)JVar8.ptr & 0xffffffff00000000;
  }
  else {
LAB_00162d85:
    if ((0xfffffff4 < (uint)obj.tag) &&
       (iVar6 = *JVar8.ptr, *(int *)JVar8.ptr = iVar6 + -1, iVar6 < 2)) {
      __JS_FreeValueRT(ctx->rt,obj);
    }
    uVar9 = 0;
    obj = (JSValue)(ZEXT816(6) << 0x40);
  }
  JVar13.u.ptr = (void *)((ulong)obj.u.ptr & 0xffffffff | uVar9);
  JVar13.tag = obj.tag;
  return JVar13;
}

Assistant:

static JSValue js_array_reverse(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, lval, hval;
    JSValue *arrp;
    int64_t len, l, h;
    int l_present, h_present;
    uint32_t count32;

    lval = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
        uint32_t ll, hh;

        if (count32 > 1) {
            for (ll = 0, hh = count32 - 1; ll < hh; ll++, hh--) {
                lval = arrp[ll];
                arrp[ll] = arrp[hh];
                arrp[hh] = lval;
            }
        }
        return obj;
    }

    for (l = 0, h = len - 1; l < h; l++, h--) {
        l_present = JS_TryGetPropertyInt64(ctx, obj, l, &lval);
        if (l_present < 0)
            goto exception;
        h_present = JS_TryGetPropertyInt64(ctx, obj, h, &hval);
        if (h_present < 0)
            goto exception;
        if (h_present) {
            if (JS_SetPropertyInt64(ctx, obj, l, hval) < 0)
                goto exception;

            if (l_present) {
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            } else {
                if (JS_DeletePropertyInt64(ctx, obj, h, JS_PROP_THROW) < 0)
                    goto exception;
            }
        } else {
            if (l_present) {
                if (JS_DeletePropertyInt64(ctx, obj, l, JS_PROP_THROW) < 0)
                    goto exception;
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            }
        }
    }
    return obj;

 exception:
    JS_FreeValue(ctx, lval);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}